

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O0

size_t __thiscall
bv::internal::bt_impl<2048UL,_(bv::allocation_policy_t)0>::alloc_node
          (bt_impl<2048UL,_(bv::allocation_policy_t)0> *this)

{
  bt_impl<2048UL,_(bv::allocation_policy_t)0> *in_RDI;
  size_t node;
  bt_impl<2048UL,_(bv::allocation_policy_t)0> *this_00;
  
  this_00 = (bt_impl<2048UL,_(bv::allocation_policy_t)0> *)in_RDI->free_node;
  in_RDI->free_node = (size_t)((long)&this_00->capacity + 1);
  used_nodes(in_RDI);
  reserve_nodes(this_00,(size_t)in_RDI);
  return (size_t)this_00;
}

Assistant:

size_t bt_impl<W, AP>::alloc_node() {
            assert(used_nodes() < nodes_count &&
                   "Maximum number of nodes exceeded");
            
            size_t node = free_node++;
            
            if(AP == alloc_on_demand)
                reserve_nodes(used_nodes());
            
            return node;
        }